

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxUnicode.cpp
# Opt level: O1

char * Jinx::Impl::GetUtf8CstrByIndex(String *source,int64_t index)

{
  size_t sVar1;
  char *utf8Str;
  ulong uVar2;
  pointer pcVar3;
  pointer utf8Str_00;
  char *pcVar4;
  bool bVar5;
  
  if ((long)source->_M_string_length < 1) {
    uVar2 = 0;
  }
  else {
    utf8Str_00 = (source->_M_dataplus)._M_p;
    pcVar3 = utf8Str_00 + source->_M_string_length;
    uVar2 = 0;
    do {
      sVar1 = GetUtf8CharSize(utf8Str_00);
      utf8Str_00 = utf8Str_00 + sVar1;
      uVar2 = uVar2 + 1;
    } while (utf8Str_00 < pcVar3);
  }
  utf8Str = (source->_M_dataplus)._M_p;
  if (index - 1U < uVar2) {
    if (1 < (ulong)index && 0 < (long)source->_M_string_length) {
      pcVar4 = utf8Str + source->_M_string_length;
      uVar2 = 2;
      do {
        sVar1 = GetUtf8CharSize(utf8Str);
        utf8Str = utf8Str + sVar1;
        if (pcVar4 <= utf8Str) {
          return utf8Str;
        }
        bVar5 = uVar2 < (ulong)index;
        uVar2 = uVar2 + 1;
      } while (bVar5);
    }
  }
  else {
    LogWriteLine(Error,"Attempted to access string %s with out of bounds index %zu",utf8Str,index);
    utf8Str = (char *)0x0;
  }
  return utf8Str;
}

Assistant:

inline_t const char * GetUtf8CstrByIndex(const String & source, int64_t index)
	{
		size_t idx = static_cast<size_t>(index);
		if (idx > GetStringCount(source) || idx < 1)
		{
			LogWriteLine(LogLevel::Error, "Attempted to access string %s with out of bounds index %zu", source.c_str(), idx);
			return nullptr;
		}
		const char * cstr = source.c_str();
		const char * end = cstr + source.size();
		size_t i = 1;
		while (cstr < end && i < idx)
		{
			cstr += GetUtf8CharSize(cstr);
			++i;
		}
		return cstr;
	}